

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

QSize __thiscall QMdiSubWindow::sizeHint(QMdiSubWindow *this)

{
  long lVar1;
  bool bVar2;
  undefined4 uVar3;
  QMdiSubWindowPrivate *this_00;
  QWidget *pQVar4;
  QSize QVar5;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindowPrivate *d;
  QSize size;
  int minWidth;
  int margin;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QSize *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  QMdiSubWindowPrivate *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QMdiSubWindow *)0x6373aa);
  QMdiSubWindowPrivate::sizeParameters
            (this_01,(int *)this_00,
             (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  uVar3 = 0x55555554;
  QMdiSubWindowPrivate::titleBarHeight(this_00);
  QSize::QSize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x637418);
  in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffff;
  if (bVar2) {
    pQVar4 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x637438);
    (**(code **)(*(long *)pQVar4 + 0x70))();
    bVar2 = QSize::isValid((QSize *)CONCAT44(in_stack_ffffffffffffffb4,uVar3));
    in_stack_ffffffffffffffb4 = (uint)bVar2 << 0x18;
  }
  if ((char)(in_stack_ffffffffffffffb4 >> 0x18) != '\0') {
    pQVar4 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x63746f);
    (**(code **)(*(long *)pQVar4 + 0x70))();
    QSize::operator+=(in_stack_ffffffffffffffa0,
                      (QSize *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x78))();
  QVar5 = QSize::expandedTo((QSize *)in_RDI,in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return QVar5;
}

Assistant:

QSize QMdiSubWindow::sizeHint() const
{
    Q_D(const QMdiSubWindow);
    int margin, minWidth;
    d->sizeParameters(&margin, &minWidth);
    QSize size(2 * margin, d->titleBarHeight() + margin);
    if (d->baseWidget && d->baseWidget->sizeHint().isValid())
        size += d->baseWidget->sizeHint();
    return size.expandedTo(minimumSizeHint());
}